

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

iterator __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
::find<char[2]>(raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                *this,key_arg<char[2]> *key)

{
  char *pcVar1;
  ctrl_t *pcVar2;
  slot_type *psVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  ushort uVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  int iVar23;
  uint uVar24;
  anon_union_8_1_a8a14541_for_iterator_1 extraout_RDX;
  anon_union_8_1_a8a14541_for_iterator_1 extraout_RDX_00;
  anon_union_8_1_a8a14541_for_iterator_1 aVar25;
  long lVar26;
  undefined1 uVar27;
  size_t hashval;
  probe_seq<16UL> *unaff_R15;
  bool bVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  iterator iVar33;
  __m128i match;
  size_t local_88;
  char local_68;
  char cStack_67;
  char cStack_66;
  char cStack_65;
  probe_seq<16UL> local_48;
  
  auVar32 = std::_Hash_bytes("a",1,0xc70f6907);
  aVar25 = auVar32._8_8_;
  if (this->ctrl_ != (ctrl_t *)0x0) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = auVar32._0_8_;
    hashval = SUB168(auVar5 * ZEXT816(0xde5fb9d2630458e9),8) +
              SUB168(auVar5 * ZEXT816(0xde5fb9d2630458e9),0);
    unaff_R15 = &local_48;
    probe(unaff_R15,this,hashval);
    pcVar2 = this->ctrl_;
    psVar3 = this->slots_;
    uVar27 = (undefined1)hashval;
    auVar32 = ZEXT216(CONCAT11(uVar27,uVar27) & 0x7f7f);
    auVar32 = pshuflw(auVar32,auVar32,0);
    local_88 = local_48.index_;
    aVar25 = extraout_RDX;
    do {
      pcVar1 = pcVar2 + local_48.offset_;
      cVar7 = *pcVar1;
      cVar8 = pcVar1[1];
      cVar9 = pcVar1[2];
      cVar10 = pcVar1[3];
      cVar11 = pcVar1[4];
      cVar12 = pcVar1[5];
      cVar13 = pcVar1[6];
      cVar14 = pcVar1[7];
      cVar15 = pcVar1[8];
      cVar16 = pcVar1[9];
      cVar17 = pcVar1[10];
      cVar18 = pcVar1[0xb];
      cVar19 = pcVar1[0xc];
      cVar20 = pcVar1[0xd];
      cVar21 = pcVar1[0xe];
      cVar22 = pcVar1[0xf];
      local_68 = auVar32[0];
      cStack_67 = auVar32[1];
      cStack_66 = auVar32[2];
      cStack_65 = auVar32[3];
      auVar30[0] = -(local_68 == cVar7);
      auVar30[1] = -(cStack_67 == cVar8);
      auVar30[2] = -(cStack_66 == cVar9);
      auVar30[3] = -(cStack_65 == cVar10);
      auVar30[4] = -(local_68 == cVar11);
      auVar30[5] = -(cStack_67 == cVar12);
      auVar30[6] = -(cStack_66 == cVar13);
      auVar30[7] = -(cStack_65 == cVar14);
      auVar30[8] = -(local_68 == cVar15);
      auVar30[9] = -(cStack_67 == cVar16);
      auVar30[10] = -(cStack_66 == cVar17);
      auVar30[0xb] = -(cStack_65 == cVar18);
      auVar30[0xc] = -(local_68 == cVar19);
      auVar30[0xd] = -(cStack_67 == cVar20);
      auVar30[0xe] = -(cStack_66 == cVar21);
      auVar30[0xf] = -(cStack_65 == cVar22);
      uVar6 = (ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe | (ushort)(auVar30[0xf] >> 7) << 0xf;
      bVar28 = uVar6 == 0;
      if (!bVar28) {
        uVar24 = (uint)uVar6;
        bVar28 = false;
        do {
          uVar4 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
            }
          }
          unaff_R15 = (probe_seq<16UL> *)(uVar4 + local_48.offset_ & local_48.mask_);
          aVar25 = (anon_union_8_1_a8a14541_for_iterator_1)
                   psVar3[(long)unaff_R15].pair.first._M_string_length;
          if (aVar25.slot_ == (slot_type *)0x1) {
            iVar23 = bcmp(psVar3[(long)unaff_R15].pair.first._M_dataplus._M_p,"a",1);
            bVar29 = iVar23 == 0;
            aVar25 = extraout_RDX_00;
          }
          else {
            bVar29 = false;
          }
          if (bVar29) goto LAB_00133990;
          uVar24 = uVar24 - 1 & uVar24;
          bVar28 = uVar24 == 0;
        } while (!bVar28);
        bVar28 = true;
      }
LAB_00133990:
      if (bVar28) {
        auVar31[0] = -(cVar7 == -0x80);
        auVar31[1] = -(cVar8 == -0x80);
        auVar31[2] = -(cVar9 == -0x80);
        auVar31[3] = -(cVar10 == -0x80);
        auVar31[4] = -(cVar11 == -0x80);
        auVar31[5] = -(cVar12 == -0x80);
        auVar31[6] = -(cVar13 == -0x80);
        auVar31[7] = -(cVar14 == -0x80);
        auVar31[8] = -(cVar15 == -0x80);
        auVar31[9] = -(cVar16 == -0x80);
        auVar31[10] = -(cVar17 == -0x80);
        auVar31[0xb] = -(cVar18 == -0x80);
        auVar31[0xc] = -(cVar19 == -0x80);
        auVar31[0xd] = -(cVar20 == -0x80);
        auVar31[0xe] = -(cVar21 == -0x80);
        auVar31[0xf] = -(cVar22 == -0x80);
        if ((((((((((((((((auVar31 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar31 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar31 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar31 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar31 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar31 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar31 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar31 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar31 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar31 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar31 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar31 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar31 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar31 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar31 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar31[0xf]
           ) {
          lVar26 = local_48.offset_ + local_88;
          local_88 = local_88 + 0x10;
          local_48.offset_ = lVar26 + 0x10U & local_48.mask_;
          bVar28 = true;
        }
        else {
          bVar28 = false;
        }
      }
      else {
        bVar28 = false;
      }
    } while (bVar28);
  }
  iVar33.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)(anon_union_8_1_a8a14541_for_iterator_1)aVar25.slot_;
  iVar33.ctrl_ = (ctrl_t *)(this->slots_ + (long)unaff_R15);
  return iVar33;
}

Assistant:

iterator find(const key_arg<K>& key) {
        return find(key, this->hash(key));
    }